

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O1

void __thiscall
GlobOpt::CaptureArguments
          (GlobOpt *this,BasicBlock *block,BailOutInfo *bailOutInfo,JitArenaAllocator *allocator)

{
  Type TVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  BVSparse<Memory::JitArenaAllocator> *pBVar7;
  SymID id;
  Type_conflict pBVar8;
  ulong uVar9;
  ulong uVar10;
  
  pBVar8 = ((this->currentBlock->globOptData).argObjSyms)->head;
  if (pBVar8 != (Type_conflict)0x0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      uVar10 = (pBVar8->data).word;
      if (uVar10 != 0) {
        TVar1 = pBVar8->startIndex;
        uVar9 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        do {
          id = TVar1 + (BVIndex)uVar9;
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar9);
          pSVar6 = SymTable::FindStackSym(this->func->m_symTable,id);
          if (pSVar6 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x123,"(stackSym != nullptr)","stackSym != nullptr");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar5 = 0;
          }
          if ((pSVar6->field_0x19 & 0x20) != 0) {
            if (bailOutInfo->capturedValues->argObjSyms ==
                (BVSparse<Memory::JitArenaAllocator> *)0x0) {
              pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
                       new<Memory::JitArenaAllocator>(0x20,allocator,0x3f1274);
              pBVar7->head = (Type_conflict)0x0;
              pBVar7->lastFoundIndex = (Type_conflict)0x0;
              pBVar7->alloc = allocator;
              pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
              bailOutInfo->capturedValues->argObjSyms = pBVar7;
            }
            BVSparse<Memory::JitArenaAllocator>::Set(bailOutInfo->capturedValues->argObjSyms,id);
          }
          uVar10 = uVar10 & ~(1L << (uVar9 & 0x3f));
          lVar2 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          uVar9 = (ulong)(-(uint)(uVar10 == 0) | (uint)lVar2);
        } while (uVar10 != 0);
      }
      pBVar8 = pBVar8->next;
    } while (pBVar8 != (Type)0x0);
  }
  return;
}

Assistant:

void
GlobOpt::CaptureArguments(BasicBlock *block, BailOutInfo * bailOutInfo, JitArenaAllocator *allocator)
{
    FOREACH_BITSET_IN_SPARSEBV(id, this->currentBlock->globOptData.argObjSyms)
    {
        StackSym * stackSym = this->func->m_symTable->FindStackSym(id);
        Assert(stackSym != nullptr);
        if (!stackSym->HasByteCodeRegSlot())
        {
            continue;
        }

        if (!bailOutInfo->capturedValues->argObjSyms)
        {
            bailOutInfo->capturedValues->argObjSyms = JitAnew(allocator, BVSparse<JitArenaAllocator>, allocator);
        }

        bailOutInfo->capturedValues->argObjSyms->Set(id);
        // Add to BailOutInfo
    }
    NEXT_BITSET_IN_SPARSEBV
}